

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O0

void validationinterface_tests::unregister_validation_interface_race_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  unregister_validation_interface_race t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  std_string *in_stack_fffffffffffff180;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff188;
  unregister_validation_interface_race *in_stack_fffffffffffff198;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  const_string *in_stack_fffffffffffff1b0;
  const_string *file;
  unregister_validation_interface_race *in_stack_fffffffffffff1b8;
  unit_test_log_t *this_00;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [1568];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [37])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  unregister_validation_interface_race::unregister_validation_interface_race
            (in_stack_fffffffffffff198);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [37])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [16])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::
  setup_conditional<validationinterface_tests::unregister_validation_interface_race>
            ((unregister_validation_interface_race *)0xd09ede);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [37])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [13])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  unregister_validation_interface_race::test_method(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [37])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::
  teardown_conditional<validationinterface_tests::unregister_validation_interface_race>
            ((unregister_validation_interface_race *)0xd0a12e);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  file = local_c88;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  msg = boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [37])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  unregister_validation_interface_race::~unregister_validation_interface_race
            ((unregister_validation_interface_race *)in_stack_fffffffffffff178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unregister_validation_interface_race)
{
    std::atomic<bool> generate{true};

    // Start thread to generate notifications
    std::thread gen{[&] {
        const CBlock block_dummy;
        BlockValidationState state_dummy;
        while (generate) {
            m_node.validation_signals->BlockChecked(block_dummy, state_dummy);
        }
    }};

    // Start thread to consume notifications
    std::thread sub{[&] {
        // keep going for about 1 sec, which is 250k iterations
        for (int i = 0; i < 250000; i++) {
            auto sub = std::make_shared<TestSubscriberNoop>();
            m_node.validation_signals->RegisterSharedValidationInterface(sub);
            m_node.validation_signals->UnregisterSharedValidationInterface(sub);
        }
        // tell the other thread we are done
        generate = false;
    }};

    gen.join();
    sub.join();
    BOOST_CHECK(!generate);
}